

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O2

void __thiscall SuiteMessageTests::TestrejectSetString::RunImpl(TestrejectSetString *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  FieldBase *pFVar3;
  TestDetails **ppTVar4;
  RefSeqNum refSeqNum;
  Text text;
  Reject object;
  int local_24c;
  TestDetails local_248;
  FieldBase local_228;
  FieldBase local_1c8;
  Reject local_168;
  
  FIX42::Reject::Reject(&local_168);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,
             "8=FIX.4.2\x019=36\x0135=3\x0145=73\x0158=This Message SUCKS!!!\x0110=029\x01",
             (allocator<char> *)&local_1c8);
  FIX::Message::setString((Message *)&local_168,(string *)&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  FIX::RefSeqNum::RefSeqNum((RefSeqNum *)&local_228);
  FIX::Text::Text((Text *)&local_1c8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_24c = 0x49;
  pFVar3 = FIX::FieldMap::getField((FieldMap *)&local_168,&local_228);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_248,*ppTVar4,0x2d9);
  UnitTest::CheckEqual<int,FIX::RefSeqNum>(pTVar1,&local_24c,(RefSeqNum *)pFVar3,&local_248);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  pFVar3 = FIX::FieldMap::getField((FieldMap *)&local_168,&local_1c8);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_248,*ppTVar4,0x2da);
  UnitTest::CheckEqual<char[22],FIX::Text>
            (pTVar1,(char (*) [22])"This Message SUCKS!!!",(Text *)pFVar3,&local_248);
  FIX::FieldBase::~FieldBase(&local_1c8);
  FIX::FieldBase::~FieldBase(&local_228);
  FIX::Message::~Message((Message *)&local_168);
  return;
}

Assistant:

TEST(rejectSetString)
{
  Reject object;

  object.setString
    ( "8=FIX.4.2\0019=36\00135=3\00145=73\001"
      "58=This Message SUCKS!!!\00110=029\001" );

  RefSeqNum refSeqNum;
  Text text;
  CHECK_EQUAL( 73, object.get( refSeqNum ) );
  CHECK_EQUAL( "This Message SUCKS!!!", object.get( text ) );
}